

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O0

void setup_lambdas(warm_cb *data)

{
  uint uVar1;
  vector<float,_std::allocator<float>_> *this;
  reference pvVar2;
  long in_RDI;
  float fVar3;
  uint32_t i_4;
  uint32_t i_3;
  uint32_t mid;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  vector<float,_std::allocator<float>_> *lambdas;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar4;
  undefined4 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_14;
  
  this = (vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0);
  for (local_14 = 0; local_14 < *(uint *)(in_RDI + 0x80); local_14 = local_14 + 1) {
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (value_type_conflict5 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
              );
  }
  if (((*(byte *)(in_RDI + 0x84) & 1) == 0) && ((*(byte *)(in_RDI + 0x85) & 1) != 0)) {
    for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x80); local_1c = local_1c + 1) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](this,(ulong)local_1c);
      *pvVar2 = 1.0;
    }
  }
  else if (((*(byte *)(in_RDI + 0x85) & 1) == 0) && ((*(byte *)(in_RDI + 0x84) & 1) != 0)) {
    for (local_20 = 0; local_20 < *(uint *)(in_RDI + 0x80); local_20 = local_20 + 1) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](this,(ulong)local_20);
      *pvVar2 = 0.0;
    }
  }
  else {
    uVar1 = *(uint *)(in_RDI + 0x80) >> 1;
    local_28 = uVar1;
    if ((*(int *)(in_RDI + 0x98) == 1) || (*(int *)(in_RDI + 0x98) == 2)) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](this,(ulong)uVar1);
      *pvVar2 = 0.5;
    }
    else {
      fVar3 = minimax_lambda(*(float *)(in_RDI + 0xac));
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](this,(ulong)uVar1);
      *pvVar2 = fVar3;
    }
    for (; local_28 != 0; local_28 = local_28 - 1) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](this,(ulong)local_28);
      fVar3 = *pvVar2 / 2.0;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](this,(ulong)(local_28 - 1));
      *pvVar2 = fVar3;
    }
    while (uVar4 = uVar1 + 1, uVar4 < *(uint *)(in_RDI + 0x80)) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](this,(ulong)uVar1);
      fVar3 = 1.0 - (1.0 - *pvVar2) / 2.0;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](this,(ulong)uVar4);
      *pvVar2 = fVar3;
      uVar1 = uVar4;
    }
    if ((*(int *)(in_RDI + 0x98) == 4) || (*(int *)(in_RDI + 0x98) == 2)) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](this,0);
      *pvVar2 = 0.0;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         (this,(ulong)(*(int *)(in_RDI + 0x80) - 1));
      *pvVar2 = 1.0;
    }
  }
  return;
}

Assistant:

void setup_lambdas(warm_cb& data)
{
	// The lambdas are arranged in ascending order
	vector<float>& lambdas = data.lambdas;
	for (uint32_t i = 0; i<data.choices_lambda; i++)
		lambdas.push_back(0.f);

	//interaction only: set all lambda's to be identically 1
	if (!data.upd_ws && data.upd_inter)
	{
		for (uint32_t i = 0; i<data.choices_lambda; i++)
			lambdas[i] = 1.0;
		return;
	}

	//warm start only: set all lambda's to be identically 0
	if (!data.upd_inter && data.upd_ws)
	{
		for (uint32_t i = 0; i<data.choices_lambda; i++)
			lambdas[i] = 0.0;
		return;
	}

	uint32_t mid = data.choices_lambda / 2;

	if (data.lambda_scheme == ABS_CENTRAL || data.lambda_scheme == ABS_CENTRAL_ZEROONE)
		lambdas[mid] = 0.5;
	else
		lambdas[mid] = minimax_lambda(data.epsilon);

	for (uint32_t i = mid; i > 0; i--)
		lambdas[i-1] = lambdas[i] / 2.0;

	for (uint32_t i = mid+1; i < data.choices_lambda; i++)
		lambdas[i] = 1 - (1-lambdas[i-1]) / 2.0;

	if (data.lambda_scheme == MINIMAX_CENTRAL_ZEROONE || data.lambda_scheme == ABS_CENTRAL_ZEROONE)
	{
		lambdas[0] = 0.0;
		lambdas[data.choices_lambda-1] = 1.0;
	}
}